

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M1P<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  double dVar1;
  size_type sVar2;
  ostream *this;
  reference pvVar3;
  reference pvVar4;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_00;
  reference pvVar5;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pMVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar9;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *this_01;
  double extraout_XMM0_Qa;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar10;
  XprTypeNested local_1b50;
  XprTypeNested local_1b48;
  XprTypeNested local_1b40;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  local_1b38;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  local_1b28;
  Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1b10;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1af0;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1ac8;
  undefined1 local_1a98 [8];
  Matrix<double,_4,_4,_0,_4,_4> sol;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_19db [3];
  Matrix<double,4,4,0,4,4> local_19d8 [8];
  Matrix<double,_4,_4,_0,_4,_4> TV2;
  Scalar local_1950;
  Scalar local_1948;
  Scalar local_1940;
  Scalar local_1938;
  double local_1930;
  double local_1928;
  Scalar local_1920;
  double local_1918;
  double local_1910;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1908;
  undefined1 local_18e8 [8];
  Matrix<double,_3,_3,_0,_3,_3> V2;
  double alpha2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1890;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1868;
  undefined1 local_1830 [8];
  Matrix<double,_3,_1,_0,_3,_1> w2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_17db [3];
  Matrix<double,4,4,0,4,4> local_17d8 [8];
  Matrix<double,_4,_4,_0,_4,_4> TV1;
  Scalar local_1750;
  Scalar local_1748;
  Scalar local_1740;
  Scalar local_1738;
  double local_1730;
  double local_1728;
  Scalar local_1720;
  double local_1718;
  double local_1710;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1708;
  undefined1 local_16e8 [8];
  Matrix<double,_3,_3,_0,_3,_3> V1;
  double alpha1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1690;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1668;
  undefined1 local_1630 [8];
  Matrix<double,_3,_1,_0,_3,_1> w;
  Type local_15e0;
  Type local_15a8;
  Type local_1570;
  Type local_1538;
  Type local_1500;
  non_const_type local_14c8;
  XprTypeNested local_14c0;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_14b8;
  Matrix<double,4,1,0,4,1> local_14a8 [8];
  Matrix<double,_4,_1,_0,_4,_1> Nuu;
  XprTypeNested local_1480;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_1478;
  Matrix<double,4,1,0,4,1> local_1468 [8];
  Matrix<double,_4,_1,_0,_4,_1> Piu;
  Matrix<double,6,1,0,6,1> local_1438 [8];
  Matrix<double,_6,_1,_0,_6,_1> lu2;
  Matrix<double,6,1,0,6,1> local_13f8 [8];
  Matrix<double,_6,_1,_0,_6,_1> lu1;
  Type local_13c0;
  Matrix<double,_3,_1,_0,_3,_1> local_1388;
  Matrix<double,_3,_3,_0,_3,_3> local_1370;
  NegativeReturnType local_1328;
  Type local_1318;
  Matrix<double,_3,_1,_0,_3,_1> local_12e0;
  Matrix<double,_3,_3,_0,_3,_3> local_12c8;
  NegativeReturnType local_1280;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_126b [3];
  Matrix<double,6,6,0,6,6> local_1268 [8];
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_113b [3];
  Matrix<double,6,6,0,6,6> local_1138 [8];
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_fdb [3];
  Matrix<double,4,4,0,4,4> local_fd8 [8];
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_f1b [3];
  Matrix<double,4,4,0,4,4> local_f18 [8];
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_e90;
  type local_e68;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_e50;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_e18;
  undefined1 local_dc0 [8];
  Matrix<double,_3,_1,_0,_3,_1> p2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_da0;
  type local_d78;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_d60;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_d28;
  undefined1 local_cd0 [8];
  Matrix<double,_3,_1,_0,_3,_1> p1;
  Matrix<double,3,1,0,3,1> local_c80 [8];
  Matrix<double,_3,_1,_0,_3,_1> n2;
  Matrix<double,3,1,0,3,1> local_c30 [8];
  Matrix<double,_3,_1,_0,_3,_1> n1;
  Matrix<double,3,1,0,3,1> local_be0 [8];
  Matrix<double,_3,_1,_0,_3,_1> m2;
  Matrix<double,3,1,0,3,1> local_b90 [8];
  Matrix<double,_3,_1,_0,_3,_1> dir2;
  Matrix<double,3,1,0,3,1> local_b40 [8];
  Matrix<double,_3,_1,_0,_3,_1> m1;
  Matrix<double,3,1,0,3,1> local_af0 [8];
  Matrix<double,_3,_1,_0,_3,_1> dir1;
  XprTypeNested local_ad0;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_ac8;
  Matrix<double,4,1,0,4,1> local_ab8 [8];
  Matrix<double,_4,_1,_0,_4,_1> NuU;
  XprTypeNested local_a90;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_a88;
  Matrix<double,4,1,0,4,1> local_a78 [8];
  Matrix<double,_4,_1,_0,_4,_1> PiU;
  Matrix<double,6,1,0,6,1> local_a48 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU2;
  Matrix<double,6,1,0,6,1> local_a08 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU1;
  Type local_9d0;
  Type local_998;
  Type local_960;
  Matrix<double,_3,_1,_0,_3,_1> local_928;
  Matrix<double,_3,_3,_0,_3,_3> local_910;
  NegativeReturnType local_8c8;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_8b8;
  Type local_870;
  Type local_838;
  Type local_800;
  Type local_7c8;
  Type local_790;
  Type local_758;
  Type local_720;
  Matrix<double,_3,_1,_0,_3,_1> local_6e8;
  Matrix<double,_3,_3,_0,_3,_3> local_6d0;
  NegativeReturnType local_688;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_678;
  Type local_630;
  Type local_5f8;
  Type local_5c0;
  Type local_588;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_54b [3];
  Matrix<double,6,6,0,6,6> local_548 [8];
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_41b [3];
  Matrix<double,6,6,0,6,6> local_418 [8];
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_4,_1,_0,_4,_1> local_1d8;
  undefined1 local_1b8 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Type local_198;
  Type local_160;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_128;
  undefined1 local_a0 [8];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  undefined1 local_58 [8];
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar2 = std::
          vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
          ::size(lCPair);
  if (sVar2 == 0) {
    sVar2 = std::
            vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            ::size(plPair);
    if (sVar2 < 2) {
      this = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
  }
  Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._7_1_ =
       0;
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::clear(__return_storage_ptr__);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_58);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<double,_4,_1,_0,_4,_1> *)
             &lines1.
              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = std::
           vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ::operator[](plPair,0);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
            ((Matrix<double,_4,_1,_0,_4,_1> *)local_58,&pvVar3->first);
  pvVar3 = std::
           vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ::operator[](plPair,0);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
            ((Matrix<double,_4,_1,_0,_4,_1> *)
             &lines1.
              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar3->second);
  pvVar4 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lCPair,0);
  std::
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  ::pair(&local_128,pvVar4);
  getPluckerCoord<double>
            ((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_a0,&local_128);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_160,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_58,3);
  this_00 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_a0,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>(&local_198,this_00,3);
  this_01 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_160;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::
  dot<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (this_01,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)&local_198);
  std::abs((int)this_01);
  if (1e-06 <= extraout_XMM0_Qa) {
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              (&local_1d8,(Matrix<double,_4,_1,_0,_4,_1> *)local_58);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<double,_4,_1,_0,_4,_1> *)
               (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),
               (Matrix<double,_4,_1,_0,_4,_1> *)
               &lines1.
                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    getPredefinedTransformations1Plane3Line<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_1b8,&local_1d8,
               (Matrix<double,_4,_1,_0,_4,_1> *)
               (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),false);
    pvVar5 = std::
             vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *)local_1b8);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),pvVar5);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_1b8);
    pvVar5 = std::
             vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *)local_1b8);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),pvVar5);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_1b8);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<double,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              (local_418,local_41b);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<double,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              (local_548,local_54b);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_588,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_5c0,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_418,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_5c0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_588);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_5f8,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
              (&local_630,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_418,3,3,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_630,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_5f8);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_720,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,1);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_6e8,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_720);
    getSkew<double>(&local_6d0,&local_6e8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              (&local_688,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_6d0);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_758,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_678,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
                 *)&local_688,
                (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_758);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
              (&local_790,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_418,3,0,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_790,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_678);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_7c8,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_800,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_548,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_800,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_7c8);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_838,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
              (&local_870,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_548,3,3,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_870,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_838);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_960,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,1);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_928,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_960);
    getSkew<double>(&local_910,&local_928);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              (&local_8c8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_910);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_998,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_8b8,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
                 *)&local_8c8,
                (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_998);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
              (&local_9d0,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_548,3,0,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_9d0,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_8b8);
    pMVar6 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                           *)local_a0,0);
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_418,pMVar6);
    lU2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar10.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (local_a08,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(lU2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array + 5));
    pMVar6 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                           *)local_a0,1);
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_548,pMVar6);
    PiU.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         (double)PVar10.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (local_a48,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(PiU.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                   .array + 3));
    NuU.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         (double)Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array + 0x23));
    local_a90.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                    (NuU.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                     m_data.array + 3));
    local_a88 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                ::operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                             *)&local_a90,
                            (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_58);
    Eigen::Matrix<double,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              (local_a78,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&local_a88);
    dir1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (double)Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array + 0xf));
    local_ad0.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                    (dir1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array + 2));
    local_ac8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                ::operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                             *)&local_ad0,
                            (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                            &lines1.
                             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<double,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              (local_ab8,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&local_ac8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)(m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a08,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (local_af0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)(dir2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a08,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (local_b40,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (dir2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)(m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a48,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (local_b90,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)(n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a48,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (local_be0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_a78,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
              (local_c30,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               (n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(p1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_ab8,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
              (local_c80,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               (p1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_d78,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_c30,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b40);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)local_a78,3);
    Eigen::operator*(&local_da0,pSVar7,(StorageBaseType *)local_af0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_d60,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d78,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_da0);
    p2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_c30,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_af0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator/(&local_d28,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                 *)&local_d60,
                p2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,3,1,0,3,1> *)local_cd0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_d28);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_e68,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_c80,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_be0);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)local_ab8,3);
    Eigen::operator*(&local_e90,pSVar7,(StorageBaseType *)local_b90);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_e50,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_e68,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_e90);
    Tu1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
         Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_c80,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b90);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator/(&local_e18,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                 *)&local_e50,
                Tu1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,3,1,0,3,1> *)local_dc0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_e18);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              (local_f18,local_f1b);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)(Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xf),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_f18,
               3,1);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
               (Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_cd0);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              (local_fd8,local_fdb);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)(TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array + 0x23),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_fd8
               ,3,1);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
               (TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_dc0);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<double,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              (local_1138,local_113b);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<double,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              (local_1268,local_126b);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_12e0,(Matrix<double,_3,_1,_0,_3,_1> *)local_cd0);
    getSkew<double>(&local_12c8,&local_12e0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              (&local_1280,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_12c8);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
              (&local_1318,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1138,3,0,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1318,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_1280);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_1388,(Matrix<double,_3,_1,_0,_3,_1> *)local_dc0);
    getSkew<double>(&local_1370,&local_1388);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              (&local_1328,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_1370);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
              (&local_13c0,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1268,3,0,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_13c0,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_1328);
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1138,
                        (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a08);
    lu2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar10.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (local_13f8,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(lu2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                   .array + 5));
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1268,
                        (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a48);
    Piu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         (double)PVar10.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (local_1438,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(Piu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                   .array + 3));
    Nuu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         (double)Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_f18);
    local_1480.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                    (Nuu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                     m_data.array + 3));
    local_1478 = Eigen::
                 MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>::
                 operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                            *)&local_1480,
                           (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_a78);
    Eigen::Matrix<double,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              (local_1468,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&local_1478);
    local_14c8 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_fd8);
    local_14c0.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                    &local_14c8);
    local_14b8 = Eigen::
                 MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>::
                 operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                            *)&local_14c0,
                           (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_ab8);
    Eigen::Matrix<double,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              (local_14a8,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&local_14b8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_1500,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_13f8,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_af0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1500);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_1538,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_13f8,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_b40,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1538);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              (&local_1570,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_1438,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_b90,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1570);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_15a8,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_1438,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_be0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_15a8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_15e0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_1468,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_c30,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               &local_15e0);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_14a8,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_c80,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               (w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    alpha1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Matrix<double,3,1,0,3,1>>
                       ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_af0,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c30);
    Eigen::operator*(&local_1690,&alpha1,(StorageBaseType *)local_c30);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_1668,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_af0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_1690);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::normalized((PlainObject *)local_1630,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_1668);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_1630,1);
    dVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_1630,0);
    V1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         atan2(dVar1,*pSVar8);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_16e8);
    local_1710 = cos(V1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
              (&local_1708,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_16e8,
               &local_1710);
    local_1718 = sin(V1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (&local_1708,&local_1718);
    local_1720 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1720);
    local_1728 = sin(V1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    local_1728 = -local_1728;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1728);
    local_1730 = cos(V1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1730);
    local_1738 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1738);
    local_1740 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1740);
    local_1748 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1748);
    local_1750 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar9,&local_1750);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1708);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              (local_17d8,local_17db);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)(w2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_17d8,3
               ,3);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
               (w2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_16e8);
    alpha2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Matrix<double,3,1,0,3,1>>
                       ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_b90,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_c80);
    Eigen::operator*(&local_1890,&alpha2,(StorageBaseType *)local_c80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_1868,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_b90,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_1890);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::normalized((PlainObject *)local_1830,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_1868);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_1830,1);
    dVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_1830,0);
    V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         atan2(dVar1,*pSVar8);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_18e8);
    local_1910 = cos(V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
              (&local_1908,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_18e8,
               &local_1910);
    local_1918 = sin(V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (&local_1908,&local_1918);
    local_1920 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1920);
    local_1928 = sin(V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    local_1928 = -local_1928;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1928);
    local_1930 = cos(V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1930);
    local_1938 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1938);
    local_1940 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1940);
    local_1948 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1948);
    local_1950 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar9,&local_1950);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1908);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              (local_19d8,local_19db);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)(sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xf),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_19d8
               ,3,3);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
               (sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_18e8);
    local_1b40 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array + 0xf));
    local_1b48 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_fd8);
    local_1b38 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                           ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)
                            &local_1b40,
                            (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                            &local_1b48);
    local_1b50 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_19d8);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>>
    ::operator*(&local_1b28,
                (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>>
                 *)&local_1b38,
                (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)&local_1b50);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>>
    ::operator*(&local_1b10,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>>
                 *)&local_1b28,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_17d8);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
    ::operator*(&local_1af0,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                 *)&local_1b10,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_f18);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
    ::operator*(&local_1ac8,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                 *)&local_1af0,
                (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                 array + 0x23));
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
              ((Matrix<double,4,4,0,4,4> *)local_1a98,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                *)&local_1ac8);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_1a98);
    Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._7_1_
         = 1;
    predTrans.
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               *)local_1b8);
  }
  else {
    Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._7_1_
         = 1;
    predTrans.
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)local_a0);
  if ((Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3].
       _7_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}